

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_all_apis.cpp
# Opt level: O2

void __thiscall APITests::test_pwm_multi_duty(APITests *this)

{
  double dVar1;
  int iVar2;
  long lVar3;
  int iVar4;
  int iVar5;
  bool bVar6;
  allocator local_71;
  PWM p;
  string local_50;
  
  for (lVar3 = 0; lVar3 != 0x18; lVar3 = lVar3 + 8) {
    dVar1 = *(double *)((long)&DAT_00119108 + lVar3);
    GPIO::setmode(BOARD);
    GPIO::setup((this->pin_data).in_a,IN,-1);
    GPIO::setup((this->pin_data).out_a,OUT,1);
    GPIO::PWM::PWM(&p,(this->pin_data).out_a,500);
    GPIO::PWM::start(dVar1);
    iVar4 = 0;
    iVar5 = 5000;
    while (bVar6 = iVar5 != 0, iVar5 = iVar5 + -1, bVar6) {
      iVar2 = GPIO::input((this->pin_data).in_a);
      iVar4 = iVar4 + iVar2;
    }
    GPIO::PWM::stop();
    std::__cxx11::string::string((string *)&local_50,"",&local_71);
    assert::is_true((bool)(-((double)iVar4 <= ((dVar1 + 5.0) * 5000.0) / 100.0) &
                           -(((dVar1 + -5.0) * 5000.0) / 100.0 <= (double)iVar4) & 1),&local_50);
    std::__cxx11::string::~string((string *)&local_50);
    GPIO::cleanup();
    GPIO::PWM::~PWM(&p);
  }
  return;
}

Assistant:

void test_pwm_multi_duty()
    {
        for (auto pct : {25.0, 50.0, 75.0})
        {
            GPIO::setmode(GPIO::BOARD);
            GPIO::setup(pin_data.in_a, GPIO::IN);
            GPIO::setup(pin_data.out_a, GPIO::OUT, GPIO::HIGH);

            int count = 0;

            GPIO::PWM p(pin_data.out_a, 500);
            p.start(pct);
            constexpr int N = 5000;
            for (int i = 0; i < N; i++)
                count += GPIO::input(pin_data.in_a);

            p.stop();

            const auto delta = 5;
            const auto min_ct = N * (pct - delta) / 100.0;
            const auto max_ct = N * (pct + delta) / 100.0;

            assert::is_true(min_ct <= count && count <= max_ct);
            GPIO::cleanup();
        }
    }